

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O3

void __thiscall
cfd::core::DescriptorNode::AnalyzeChild(DescriptorNode *this,string *descriptor,uint32_t depth)

{
  char cVar1;
  int iVar2;
  CfdException *pCVar3;
  undefined8 uVar4;
  long lVar5;
  undefined4 in_register_00000014;
  ulong uVar6;
  ulong uVar7;
  uint32_t depth_work;
  string descriptor_main;
  DescriptorNode node;
  uint32_t local_224;
  uint local_220;
  uint32_t local_21c;
  string *local_218;
  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_> *local_210;
  string *local_208;
  string *local_200;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_1f8;
  undefined8 local_1f0;
  ulong local_1e8;
  CfdSourceLocation local_1e0;
  string *local_1c0;
  string local_1b8;
  undefined1 local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178 [4];
  uint32_t local_f0;
  uint32_t local_80;
  DescriptorNodeType local_78;
  string asStack_50 [32];
  
  local_1f0 = CONCAT44(in_register_00000014,depth);
  this->depth_ = depth;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  local_198._0_8_ = "cfdcore_descriptor.cpp";
  local_198._8_4_ = 900;
  local_198._16_8_ = "AnalyzeChild";
  local_224 = depth;
  logger::log<std::__cxx11::string_const&>
            ((CfdSourceLocation *)local_198,kCfdLogLevelInfo,"AnalyzeChild = {}",descriptor);
  if (descriptor->_M_string_length != 0) {
    local_218 = &this->value_;
    local_1f8 = &this->addr_prefixes_;
    local_21c = (int)local_1f0 + 1;
    local_208 = &this->parent_kind_;
    local_200 = asStack_50;
    local_210 = &this->child_node_;
    local_1c0 = (string *)&this->checksum_;
    local_1e8 = 0;
    uVar6 = 0;
    local_220 = 0;
    uVar7 = 0;
    do {
      cVar1 = (descriptor->_M_dataplus)._M_p[uVar6];
      switch(cVar1) {
      case '#':
        if ((local_1e8 & 1) == 0) {
          local_198._0_8_ = "cfdcore_descriptor.cpp";
          local_198._8_4_ = 0x393;
          local_198._16_8_ = "AnalyzeChild";
          logger::log<>((CfdSourceLocation *)local_198,kCfdLogLevelWarning,"Illegal checksum data.")
          ;
          pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
          local_198._0_8_ = local_198 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,"Illegal checksum data.","");
          CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_198);
          __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
        }
        ::std::__cxx11::string::substr((ulong)local_198,(ulong)descriptor);
        ::std::__cxx11::string::operator=(local_1c0,(string *)local_198);
        if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
          operator_delete((void *)local_198._0_8_);
        }
        ::std::__cxx11::string::substr((ulong)local_198,(ulong)descriptor);
        ::std::__cxx11::string::operator=((string *)&local_1b8,(string *)local_198);
        if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
          operator_delete((void *)local_198._0_8_);
        }
        uVar4 = 0;
        lVar5 = ::std::__cxx11::string::find((char *)local_1c0,0x219745,0);
        local_1e8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
        uVar7 = uVar6;
        if (lVar5 != -1) {
          local_198._0_8_ = "cfdcore_descriptor.cpp";
          local_198._8_4_ = 0x38e;
          local_198._16_8_ = "AnalyzeChild";
          logger::log<>((CfdSourceLocation *)local_198,kCfdLogLevelWarning,
                        "Illegal data. Multiple \'#\' symbols.");
          pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
          local_198._0_8_ = local_198 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,"Multiple \'#\' symbols.","");
          CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_198);
          __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
        }
        break;
      case '$':
      case '%':
      case '&':
      case '\'':
      case '*':
      case '+':
        break;
      case '(':
        if (local_224 == (uint32_t)local_1f0) {
          ::std::__cxx11::string::substr((ulong)local_198,(ulong)descriptor);
          ::std::__cxx11::string::operator=((string *)this,(string *)local_198);
          if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
            operator_delete((void *)local_198._0_8_);
          }
          uVar7 = uVar6 + 1;
        }
        else {
          local_220 = (uint)CONCAT71((int7)((ulong)local_1f0 >> 8),1);
        }
        local_198._0_8_ = "cfdcore_descriptor.cpp";
        local_198._8_4_ = 0x3c2;
        local_198._16_8_ = "AnalyzeChild";
        logger::log<unsigned_int&,std::__cxx11::string&>
                  ((CfdSourceLocation *)local_198,kCfdLogLevelInfo,
                   "Target`(` depth_work={}, name={}",&local_224,&this->name_);
        local_224 = local_224 + 1;
        break;
      case ')':
        local_224 = local_224 - 1;
        local_198._0_8_ = "cfdcore_descriptor.cpp";
        local_198._8_4_ = 0x3c7;
        local_198._16_8_ = "AnalyzeChild";
        logger::log<unsigned_int&>
                  ((CfdSourceLocation *)local_198,kCfdLogLevelInfo,"Target`)` depth_work = {}",
                   &local_224);
        if (local_224 == (uint32_t)local_1f0) {
          lVar5 = uVar6 - uVar7;
          ::std::__cxx11::string::substr((ulong)local_198,(ulong)descriptor);
          ::std::__cxx11::string::operator=((string *)local_218,(string *)local_198);
          if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
            operator_delete((void *)local_198._0_8_);
          }
          iVar2 = ::std::__cxx11::string::compare((char *)this);
          local_1e8 = CONCAT71((int7)((ulong)lVar5 >> 8),1);
          uVar7 = uVar6 + 1;
          if ((iVar2 != 0) && (iVar2 = ::std::__cxx11::string::compare((char *)this), iVar2 != 0)) {
            DescriptorNode((DescriptorNode *)local_198,local_1f8);
            iVar2 = ::std::__cxx11::string::compare((char *)this);
            if (iVar2 == 0) {
              local_78 = kDescriptorTypeScript;
              ::std::__cxx11::string::_M_assign((string *)local_178);
              local_220 = 0;
LAB_0018c1a1:
              local_80 = local_21c;
            }
            else {
              if ((local_220 & 1) == 0) {
                local_78 = kDescriptorTypeKey;
                ::std::__cxx11::string::_M_assign((string *)local_178);
                goto LAB_0018c1a1;
              }
              local_78 = kDescriptorTypeScript;
              AnalyzeChild((DescriptorNode *)local_198,local_218,local_21c);
              local_220 = 0;
            }
            ::std::__cxx11::string::_M_assign(local_200);
            ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
            push_back(local_210,(DescriptorNode *)local_198);
            local_1e0.filename = "cfdcore_descriptor.cpp";
            local_1e0.line = 0x3e1;
            local_1e0.funcname = "AnalyzeChild";
            logger::log<unsigned_int&,std::__cxx11::string&>
                      (&local_1e0,kCfdLogLevelInfo,"Target`)` depth_work={}, child.value={}",
                       &local_224,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_178);
            goto LAB_0018c20b;
          }
        }
        break;
      case ',':
        if ((local_220 & 1) == 0) {
          iVar2 = ::std::__cxx11::string::compare((char *)this);
          if ((iVar2 == 0) || (iVar2 = ::std::__cxx11::string::compare((char *)this), iVar2 == 0)) {
            DescriptorNode((DescriptorNode *)local_198,local_1f8);
            ::std::__cxx11::string::substr((ulong)&local_1e0,(ulong)descriptor);
            ::std::__cxx11::string::operator=((string *)local_178,(string *)&local_1e0);
            if ((char **)local_1e0.filename != &local_1e0.funcname) {
              operator_delete(local_1e0.filename);
            }
            local_1e0.filename = "cfdcore_descriptor.cpp";
            local_1e0.line = 0x39d;
            local_1e0.funcname = "AnalyzeChild";
            logger::log<std::__cxx11::string&>
                      (&local_1e0,kCfdLogLevelInfo,"multisig, node.value_ = {}",local_178);
            if ((this->child_node_).
                super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (this->child_node_).
                super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_78 = kDescriptorTypeNumber;
              local_f0 = atoi(local_178[0]._M_dataplus._M_p);
            }
            else {
              local_78 = kDescriptorTypeKey;
            }
            local_80 = local_21c;
            ::std::__cxx11::string::_M_assign(local_200);
            ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
            push_back(local_210,(DescriptorNode *)local_198);
          }
          else {
            iVar2 = ::std::__cxx11::string::compare((char *)this);
            if ((iVar2 != 0) ||
               ((this->child_node_).
                super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (this->child_node_).
                super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                ._M_impl.super__Vector_impl_data._M_finish)) break;
            DescriptorNode((DescriptorNode *)local_198,local_1f8);
            ::std::__cxx11::string::substr((ulong)&local_1e0,(ulong)descriptor);
            ::std::__cxx11::string::operator=((string *)local_178,(string *)&local_1e0);
            if ((char **)local_1e0.filename != &local_1e0.funcname) {
              operator_delete(local_1e0.filename);
            }
            local_78 = kDescriptorTypeKey;
            local_80 = local_21c;
            ::std::__cxx11::string::_M_assign(local_200);
            ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
            push_back(local_210,(DescriptorNode *)local_198);
          }
LAB_0018c20b:
          ~DescriptorNode((DescriptorNode *)local_198);
          uVar7 = uVar6 + 1;
        }
        break;
      default:
        if (cVar1 == ' ') {
          uVar7 = uVar7 + 1;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < descriptor->_M_string_length);
  }
  if (((((this->name_)._M_string_length != 0) &&
       (iVar2 = ::std::__cxx11::string::compare((char *)this), iVar2 != 0)) &&
      (iVar2 = ::std::__cxx11::string::compare((char *)this), iVar2 != 0)) &&
     ((this->child_node_).
      super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->child_node_).
      super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    local_198._0_8_ = "cfdcore_descriptor.cpp";
    local_198._8_4_ = 0x3eb;
    local_198._16_8_ = "AnalyzeChild";
    logger::log<>((CfdSourceLocation *)local_198,kCfdLogLevelWarning,"Failed to child node empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_198._0_8_ = local_198 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"Failed to child node empty.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_198);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (local_1b8._M_string_length != 0) {
    CheckChecksum(this,&local_1b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DescriptorNode::AnalyzeChild(
    const std::string& descriptor, uint32_t depth) {
  bool is_terminate = false;
  size_t offset = 0;
  uint32_t depth_work = depth;
  bool exist_child_node = false;
  depth_ = depth;
  std::string descriptor_main;
  info(CFD_LOG_SOURCE, "AnalyzeChild = {}", descriptor);

  for (size_t idx = 0; idx < descriptor.size(); ++idx) {
    const char& str = descriptor[idx];
    if (str == '#') {
      if (is_terminate) {
        offset = idx;
        checksum_ = descriptor.substr(idx + 1);
        descriptor_main = descriptor.substr(0, idx);
        if (checksum_.find("#") != std::string::npos) {
          warn(CFD_LOG_SOURCE, "Illegal data. Multiple '#' symbols.");
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Multiple '#' symbols.");
        }
      } else {
        warn(CFD_LOG_SOURCE, "Illegal checksum data.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Illegal checksum data.");
      }
    } else if (str == ',') {
      if (exist_child_node) {
        // through by child node
      } else if ((name_ == "multi") || (name_ == "sortedmulti")) {
        DescriptorNode node(addr_prefixes_);
        node.value_ = descriptor.substr(offset, idx - offset);
        info(CFD_LOG_SOURCE, "multisig, node.value_ = {}", node.value_);
        if (child_node_.empty()) {
          node.node_type_ = DescriptorNodeType::kDescriptorTypeNumber;
          node.number_ = atoi(node.value_.c_str());
        } else {
          node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
        }
        node.depth_ = depth + 1;
        node.parent_kind_ = parent_kind_;
        child_node_.push_back(node);
        offset = idx + 1;
      } else if (name_ == "tr") {
        if (child_node_.empty()) {
          DescriptorNode node(addr_prefixes_);
          node.value_ = descriptor.substr(offset, idx - offset);
          node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
          node.depth_ = depth + 1;
          node.parent_kind_ = parent_kind_;
          child_node_.push_back(node);
          offset = idx + 1;
        }
      } else {
        // ignore for miniscript
        // warn(CFD_LOG_SOURCE, "Illegal command.");
        // throw CfdException(
        //     CfdError::kCfdIllegalArgumentError, "Illegal command.");
      }
    } else if (str == ' ') {
      ++offset;
    } else if (str == '(') {
      if (depth_work == depth) {
        name_ = descriptor.substr(offset, idx - offset);
        offset = idx + 1;
      } else {
        exist_child_node = true;
      }
      info(
          CFD_LOG_SOURCE, "Target`(` depth_work={}, name={}", depth_work,
          name_);
      ++depth_work;
    } else if (str == ')') {
      --depth_work;
      info(CFD_LOG_SOURCE, "Target`)` depth_work = {}", depth_work);
      if (depth_work == depth) {
        value_ = descriptor.substr(offset, idx - offset);
        is_terminate = true;
        offset = idx + 1;
        if ((name_ == "addr") || (name_ == "raw")) {
          // do nothing
        } else {
          DescriptorNode node(addr_prefixes_);
          if (name_ == "tr") {
            node.node_type_ = DescriptorNodeType::kDescriptorTypeScript;
            node.value_ = value_;
            node.depth_ = depth + 1;
            exist_child_node = false;
          } else if (exist_child_node) {
            node.node_type_ = DescriptorNodeType::kDescriptorTypeScript;
            node.AnalyzeChild(value_, depth + 1);
            exist_child_node = false;
          } else {
            node.node_type_ = DescriptorNodeType::kDescriptorTypeKey;
            node.value_ = value_;
            node.depth_ = depth + 1;
          }
          node.parent_kind_ = parent_kind_;
          child_node_.push_back(node);
          info(
              CFD_LOG_SOURCE, "Target`)` depth_work={}, child.value={}",
              depth_work, node.value_);
        }
      }
    }
  }

  if (name_.empty() || (name_ == "addr") || (name_ == "raw")) {
    // do nothing
  } else if (child_node_.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to child node empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to child node empty.");
  }

  if (!descriptor_main.empty()) {
    CheckChecksum(descriptor_main);
  }
}